

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

int Exa_ManAddCnf(Exa_Man_t *p,int iMint)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int Var;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint nlits;
  long lVar13;
  int local_7c;
  int pLits [3];
  
  uVar3 = p->pTruth[iMint >> 6];
  uVar7 = 0;
  uVar8 = (ulong)(uint)p->nVars;
  if (p->nVars < 1) {
    uVar8 = uVar7;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    p->VarVals[uVar7] = (uint)(((uint)iMint >> ((uint)uVar7 & 0x1f) & 1) != 0);
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->nNodes * 3 + p->iVar);
  lVar13 = (long)p->nVars;
  local_7c = p->nVars * 3;
  do {
    uVar8 = (ulong)p->nObjs;
    if ((long)uVar8 <= lVar13) {
      p->iVar = p->iVar + p->nNodes * 3;
      return 1;
    }
    iVar1 = p->nVars;
    iVar6 = (int)lVar13;
    Var = (iVar6 - iVar1) * 3 + p->iVar;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      for (lVar11 = 0; lVar11 < (int)uVar8; lVar11 = lVar11 + 1) {
        if (p->VarMarks[lVar13][lVar9][lVar11] != 0) {
          iVar5 = p->iVar;
          iVar2 = p->nVars;
          for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
            pLits[0] = Abc_Var2Lit(p->VarMarks[lVar13][lVar9][lVar11],1);
            pLits[1] = Abc_Var2Lit(Var + (int)lVar9,uVar12);
            if (lVar11 < p->nVars) {
              iVar4 = 2;
              if (uVar12 != p->VarVals[lVar11]) goto LAB_004a41f3;
            }
            else {
              pLits[2] = Abc_Var2Lit(((int)lVar11 - iVar2) * 3 + iVar5 + 2,uVar12 ^ 1);
              iVar4 = 3;
LAB_004a41f3:
              iVar4 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar4);
              if (iVar4 == 0) {
                return 0;
              }
            }
          }
          uVar8 = (ulong)(uint)p->nObjs;
        }
      }
    }
    for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
      if ((p->nObjs + -1 != iVar6) || (uVar12 != ((uint)(uVar3 >> ((byte)iMint & 0x3f)) & 1))) {
        uVar8 = 0;
        while (uVar10 = (uint)uVar8, uVar10 != 4) {
          if ((uVar12 ^ 1) != 0 || uVar10 != 0) {
            pLits[0] = Abc_Var2Lit(Var,uVar10 & 1);
            pLits[1] = Abc_Var2Lit(Var + 1,(int)(uVar8 >> 1));
            nlits = 2;
            if (p->nObjs + -1 != iVar6) {
              pLits[2] = Abc_Var2Lit(Var + 2,uVar12 ^ 1);
              nlits = 3;
            }
            if (uVar10 != 0) {
              iVar5 = Abc_Var2Lit(local_7c + iVar1 * -3 + uVar10,uVar12);
              uVar8 = (ulong)nlits;
              nlits = nlits + 1;
              pLits[uVar8] = iVar5;
            }
            iVar5 = bmcg_sat_solver_addclause(p->pSat,pLits,nlits);
            if (iVar5 == 0) {
              return 0;
            }
          }
          uVar8 = (ulong)(uVar10 + 1);
        }
      }
    }
    lVar13 = lVar13 + 1;
    local_7c = local_7c + 3;
  } while( true );
}

Assistant:

int Exa_ManAddCnf( Exa_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Abc_TtGetBit(p->pTruth, iMint);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i] = (iMint >> i) & 1;
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar + 3*p->nNodes );
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iVarStart = 1 + 3*(i - p->nVars);
        int iBaseSatVarI = p->iVar + 3*(i - p->nVars);
        for ( k = 0; k < 2; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + 3*(j - p->nVars);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + 2, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k < 4; k++ )
            {
                int pLits[4], nLits = 0;
                if ( k == 0 && n == 1 )
                    continue;
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, (k&1)  );
                pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, (k>>1) );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, !n );
                if ( k > 0 )             pLits[nLits++] = Abc_Var2Lit( iVarStart +  k-1,  n );
                assert( nLits <= 4 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += 3*p->nNodes;
    return 1;
}